

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O0

int valid_version(void)

{
  int local_18;
  int local_14;
  int revision;
  int minor;
  int major;
  
  glfwGetVersion(&revision,&local_14,&local_18);
  if (revision == 3) {
    if ((local_14 != 2) || (local_18 != 1)) {
      printf("*** WARNING: GLFW version mismatch! ***\n");
    }
    minor = 1;
  }
  else {
    printf("*** ERROR: GLFW major version mismatch! ***\n");
    minor = 0;
  }
  return minor;
}

Assistant:

static int valid_version(void)
{
    int major, minor, revision;
    glfwGetVersion(&major, &minor, &revision);

    if (major != GLFW_VERSION_MAJOR)
    {
        printf("*** ERROR: GLFW major version mismatch! ***\n");
        return GLFW_FALSE;
    }

    if (minor != GLFW_VERSION_MINOR || revision != GLFW_VERSION_REVISION)
        printf("*** WARNING: GLFW version mismatch! ***\n");

    return GLFW_TRUE;
}